

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O1

bool __thiscall
helics::tcp::TcpComms::establishBrokerConnection
          (TcpComms *this,shared_ptr<gmlc::networking::AsioContextManager> *ioctx,
          shared_ptr<gmlc::networking::TcpConnection> *brokerConnection)

{
  _Atomic_word *p_Var1;
  uint uVar2;
  _Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  TcpConnection *pTVar5;
  element_type *peVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  _Alloc_hider _Var9;
  int iVar10;
  int iVar11;
  uint uVar12;
  undefined4 uVar13;
  uint uVar14;
  void *__s;
  ulong extraout_RAX;
  int *piVar15;
  string *address;
  size_t __n;
  void *__buf;
  shared_ptr<gmlc::networking::TcpConnection> *psVar16;
  uint uVar17;
  ConnectionStatus status;
  ulong uVar18;
  SocketFactory *sf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
  *pBVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar22;
  uint uVar23;
  value_type *__val;
  TcpComms *pTVar24;
  bool bVar25;
  string_view message;
  string_view string1;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view string2;
  anon_class_16_2_8f9776d2 terminate;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> brkprt;
  string __str;
  vector<char,_std::allocator<char>_> rx;
  ActionMessage m;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  TcpComms *local_2c0;
  shared_ptr<gmlc::networking::TcpConnection> *local_2b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_2b0;
  element_type *local_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_280;
  string *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  shared_ptr<gmlc::networking::AsioContextManager> *local_250;
  undefined1 local_248 [12];
  int iStack_23c;
  undefined1 local_238 [176];
  char local_188;
  void *local_178;
  pointer pcStack_170;
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined1 local_148 [96];
  _Alloc_hider local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  pointer pcVar21;
  
  local_2c0 = this;
  local_2b8 = brokerConnection;
  local_250 = ioctx;
  if ((this->super_NetworkCommsInterface).brokerPort < 0) {
    iVar10 = getDefaultPort(6);
    (this->super_NetworkCommsInterface).brokerPort = iVar10;
  }
  if ((this->super_NetworkCommsInterface).encrypted == true) {
    gmlc::networking::SocketFactory::SocketFactory
              ((SocketFactory *)local_148,&this->encryption_config,true);
  }
  else {
    local_148._0_8_ = (element_type *)0x0;
    local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_148._16_8_ = 0;
  }
  uVar17 = (this->super_NetworkCommsInterface).brokerPort;
  uVar2 = -uVar17;
  if (0 < (int)uVar17) {
    uVar2 = uVar17;
  }
  uVar22 = 1;
  if (9 < uVar2) {
    uVar18 = (ulong)uVar2;
    uVar23 = 4;
    do {
      uVar22 = uVar23;
      uVar14 = (uint)uVar18;
      if (uVar14 < 100) {
        uVar22 = uVar22 - 2;
        goto LAB_002c0938;
      }
      if (uVar14 < 1000) {
        uVar22 = uVar22 - 1;
        goto LAB_002c0938;
      }
      if (uVar14 < 10000) goto LAB_002c0938;
      uVar18 = uVar18 / 10000;
      uVar23 = uVar22 + 4;
    } while (99999 < uVar14);
    uVar22 = uVar22 + 1;
  }
LAB_002c0938:
  _Var3.super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl =
       (((local_250->
         super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr)->ictx)._M_t.
       super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
       super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
       super__Head_base<0UL,_asio::io_context_*,_false>;
  local_248._0_8_ = local_238;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
             (ulong)(uVar22 + -((int)uVar17 >> 0x1f)),'-');
  CLI::std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_248._0_8_ + (ulong)(uint)-((int)uVar17 >> 0x1f)),uVar22,uVar2);
  sf = (SocketFactory *)local_148;
  gmlc::networking::establishConnection
            ((networking *)&local_e8,sf,
             (io_context *)_Var3.super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,
             &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress,
             (string *)local_248,
             (milliseconds)
             (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r);
  p_Var8 = p_Stack_e0;
  _Var9._M_p = local_e8._M_p;
  local_e8._M_p = (pointer)0x0;
  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (brokerConnection->
           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (brokerConnection->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (element_type *)_Var9._M_p;
  (brokerConnection->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
  )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
  }
  if ((TcpComms *)local_248._0_8_ != (TcpComms *)local_238) {
    sf = (SocketFactory *)(local_238._0_8_ + 1);
    operator_delete((void *)local_248._0_8_,(ulong)sf);
  }
  iVar10 = (int)sf;
  if ((brokerConnection->
      super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    local_260 = &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress;
    uVar17 = 0;
    do {
      psVar16 = local_2b8;
      pTVar24 = local_2c0;
      iVar10 = (int)sf;
      if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i &
          1U) != 0) {
        pTVar5 = (local_2b8->
                 super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (pTVar5 == (TcpConnection *)0x0) goto LAB_002c18ba;
        gmlc::networking::TcpConnection::close(pTVar5,iVar10);
        goto LAB_002c189f;
      }
      if (uVar17 == 0) {
        message._M_str = "initial connection to broker timed out ";
        message._M_len = 0x27;
        iVar10 = 0x27;
        CommsInterface::logWarning((CommsInterface *)this,message);
      }
      if ((this->super_NetworkCommsInterface).maxRetries <= (int)uVar17) {
        message_03._M_str =
             "initial connection to broker timed out exceeding max number of retries ";
        message_03._M_len = 0x47;
        iVar10 = 0x47;
        CommsInterface::logWarning((CommsInterface *)this,message_03);
        psVar16 = local_2b8;
        pTVar24 = local_2c0;
        pTVar5 = (local_2b8->
                 super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (pTVar5 == (TcpConnection *)0x0) {
          status = ERRORED;
          goto LAB_002c18bf;
        }
        gmlc::networking::TcpConnection::close(pTVar5,iVar10);
        this_00 = (psVar16->
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        (psVar16->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr = (element_type *)0x0;
        (psVar16->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        status = ERRORED;
        goto LAB_002c18ae;
      }
      if ((uVar17 & 1) == 0) {
        sched_yield();
      }
      else {
        local_248._0_8_ = (TcpComms *)0x0;
        stack0xfffffffffffffdc0 = (void **)0x5f5e100;
        do {
          pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248;
          iVar11 = nanosleep((timespec *)local_248,(timespec *)local_248);
          iVar10 = (int)pbVar19;
          if (iVar11 != -1) break;
          piVar15 = __errno_location();
        } while (*piVar15 == 4);
      }
      psVar16 = local_2b8;
      pTVar24 = local_2c0;
      if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i &
          1U) != 0) {
        pTVar5 = (local_2b8->
                 super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (pTVar5 == (TcpConnection *)0x0) goto LAB_002c18ba;
        gmlc::networking::TcpConnection::close(pTVar5,iVar10);
        goto LAB_002c189f;
      }
      uVar2 = (this->super_NetworkCommsInterface).brokerPort;
      uVar22 = -uVar2;
      if (0 < (int)uVar2) {
        uVar22 = uVar2;
      }
      uVar23 = 1;
      if (9 < uVar22) {
        uVar18 = (ulong)uVar22;
        uVar14 = 4;
        do {
          uVar23 = uVar14;
          uVar12 = (uint)uVar18;
          if (uVar12 < 100) {
            uVar23 = uVar23 - 2;
            goto LAB_002c0b40;
          }
          if (uVar12 < 1000) {
            uVar23 = uVar23 - 1;
            goto LAB_002c0b40;
          }
          if (uVar12 < 10000) goto LAB_002c0b40;
          uVar18 = uVar18 / 10000;
          uVar14 = uVar23 + 4;
        } while (99999 < uVar12);
        uVar23 = uVar23 + 1;
      }
LAB_002c0b40:
      uVar17 = uVar17 + 1;
      _Var3.super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl =
           (((local_250->
             super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->ictx)._M_t.
           super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
           super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
           super__Head_base<0UL,_asio::io_context_*,_false>;
      local_248._0_8_ = local_238;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                   (ulong)(uVar23 + -((int)uVar2 >> 0x1f)),'-');
      CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_248._0_8_ + (ulong)(uint)-((int)uVar2 >> 0x1f)),uVar23,uVar22);
      sf = (SocketFactory *)local_148;
      gmlc::networking::establishConnection
                ((networking *)&local_e8,sf,
                 (io_context *)_Var3.super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,
                 local_260,(string *)local_248,
                 (milliseconds)
                 (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r);
      p_Var8 = p_Stack_e0;
      _Var9._M_p = local_e8._M_p;
      local_e8._M_p = (pointer)0x0;
      p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (brokerConnection->
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      (brokerConnection->
      super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)_Var9._M_p;
      (brokerConnection->
      super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
      }
      if ((TcpComms *)local_248._0_8_ != (TcpComms *)local_238) {
        sf = (SocketFactory *)(local_238._0_8_ + 1);
        operator_delete((void *)local_248._0_8_,(ulong)sf);
      }
      iVar10 = (int)sf;
    } while ((brokerConnection->
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             == (element_type *)0x0);
  }
  psVar16 = local_2b8;
  pTVar24 = local_2c0;
  if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i & 1U)
      == 0) {
    uVar17 = (uint)(this->super_NetworkCommsInterface).noAckConnection;
    if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
      uVar17 = 0;
    }
    bVar25 = true;
    local_260 = (string *)CONCAT44(local_260._4_4_,uVar17);
    if ((uVar17 & 1) == 0) {
      local_148._56_8_ = &(this->super_NetworkCommsInterface).super_CommsInterface.txQueue;
      local_258 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress;
      local_158._M_allocated_capacity = (size_type)&this->rxMessageQueue;
      local_158._8_8_ = 0;
      do {
        ActionMessage::ActionMessage((ActionMessage *)&local_e8,cmd_protocol_priority);
        uVar13 = 0x12d;
        if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
          uVar13 = 0x5af;
        }
        local_e8._M_p._4_4_ = uVar13;
        pcVar21 = (this->super_NetworkCommsInterface).super_CommsInterface.brokerInitString.
                  _M_dataplus._M_p;
        __n = (this->super_NetworkCommsInterface).super_CommsInterface.brokerInitString.
              _M_string_length;
        string1._M_str =
             (this->super_NetworkCommsInterface).super_CommsInterface.brokerName._M_dataplus._M_p;
        string1._M_len =
             (this->super_NetworkCommsInterface).super_CommsInterface.brokerName._M_string_length;
        string2._M_str = pcVar21;
        string2._M_len = __n;
        ActionMessage::setStringData((ActionMessage *)&local_e8,string1,string2);
        iVar10 = (int)pcVar21;
        pTVar5 = (brokerConnection->
                 super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        ActionMessage::packetize_abi_cxx11_((string *)local_248,(ActionMessage *)&local_e8);
        gmlc::networking::TcpConnection::send(pTVar5,(int)(string *)local_248,__buf,__n,iVar10);
        if ((TcpComms *)local_248._0_8_ != (TcpComms *)local_238) {
          operator_delete((void *)local_248._0_8_,(ulong)(local_238._0_8_ + 1));
        }
        local_178 = (void *)0x0;
        pcStack_170 = (pointer)0x0;
        local_168._M_p = (pointer)0x0;
        __s = operator_new(0x200);
        local_178 = __s;
        pcStack_170 = (pointer)__s;
        local_168._M_p = (pointer)((long)__s + 0x200);
        memset(__s,0,0x200);
        peVar6 = (((brokerConnection->
                   super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->socket_).
                 super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        unique0x00005300 = &local_178;
        local_238._8_8_ =
             std::
             _Function_handler<void_(const_std::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpComms.cpp:311:33)>
             ::_M_invoke;
        local_238._0_8_ =
             std::
             _Function_handler<void_(const_std::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpComms.cpp:311:33)>
             ::_M_manager;
        local_248._0_8_ = this;
        pcStack_170 = (pointer)((long)__s + 0x200);
        (*peVar6->_vptr_Socket[3])(peVar6,__s,0x80,(string *)local_248);
        if ((_func_int **)local_238._0_8_ != (_func_int **)0x0) {
          (*(code *)local_238._0_8_)((string *)local_248,(string *)local_248,3);
        }
        pBVar20 = (BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
                   *)local_148._56_8_;
        gmlc::containers::
        BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
        ::pop<std::chrono::duration<long,std::ratio<1l,1000l>>>
                  ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)local_248,
                   (BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
                    *)local_148._56_8_,(duration<long,_std::ratio<1L,_1000L>_>)0xc8);
        psVar16 = local_2b8;
        pTVar24 = local_2c0;
        if (local_188 == '\x01') {
          if (((local_248._8_4_ == -60000) || (local_248._8_4_ == 60000)) ||
             (local_248._8_4_ == 0x1000ea60)) {
            if ((iStack_23c == 0x5ab) &&
               ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1)) {
              gmlc::containers::
              BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
              push<helics::ActionMessage&>
                        ((BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                         local_158._M_allocated_capacity,(ActionMessage *)(local_248 + 8));
              uVar18 = extraout_RAX;
            }
            else if ((iStack_23c != 0x130) ||
                    (uVar17 = (this->super_NetworkCommsInterface).PortNumber.
                              super___atomic_base<int>._M_i, uVar18 = (ulong)uVar17, (int)uVar17 < 1
                    )) {
              if (iStack_23c == 0x14d) {
                message_02._M_str = "got new broker information";
                message_02._M_len = 0x1a;
                iVar10 = 0x1a;
                CommsInterface::logMessage((CommsInterface *)this,message_02);
                gmlc::networking::TcpConnection::close
                          ((brokerConnection->
                           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr,iVar10);
                address = ActionMessage::getString_abi_cxx11_((ActionMessage *)(local_248 + 8),0);
                gmlc::networking::extractInterfaceAndPort(&local_2b0,(string *)address);
                (this->super_NetworkCommsInterface).brokerPort = local_2b0.second;
                iVar10 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_2b0,"?");
                if (iVar10 != 0) {
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                            (local_258,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_2b0);
                }
                uVar17 = (this->super_NetworkCommsInterface).brokerPort;
                uVar2 = -uVar17;
                if (0 < (int)uVar17) {
                  uVar2 = uVar17;
                }
                uVar22 = 1;
                if (9 < uVar2) {
                  uVar18 = (ulong)uVar2;
                  uVar23 = 4;
                  do {
                    uVar22 = uVar23;
                    uVar14 = (uint)uVar18;
                    if (uVar14 < 100) {
                      uVar22 = uVar22 - 2;
                      goto LAB_002c13a6;
                    }
                    if (uVar14 < 1000) {
                      uVar22 = uVar22 - 1;
                      goto LAB_002c13a6;
                    }
                    if (uVar14 < 10000) goto LAB_002c13a6;
                    uVar18 = uVar18 / 10000;
                    uVar23 = uVar22 + 4;
                  } while (99999 < uVar14);
                  uVar22 = uVar22 + 1;
                }
LAB_002c13a6:
                _Var3.super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl =
                     (((local_250->
                       super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->ictx)._M_t.
                     super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>
                     .super__Head_base<0UL,_asio::io_context_*,_false>;
                local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_construct(&local_2e0,(ulong)(uVar22 + -((int)uVar17 >> 0x1f)),'-');
                CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_2e0._M_dataplus._M_p + (uint)-((int)uVar17 >> 0x1f),uVar22,uVar2);
                gmlc::networking::establishConnection
                          ((networking *)&local_288,(SocketFactory *)local_148,
                           (io_context *)
                           _Var3.super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,
                           (string *)local_258,(string *)&local_2e0,
                           (milliseconds)
                           (this->super_NetworkCommsInterface).super_CommsInterface.
                           connectionTimeout.__r);
                p_Var8 = p_Stack_280;
                peVar7 = local_288;
                local_288 = (element_type *)0x0;
                p_Stack_280 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         (brokerConnection->
                         super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                         )._M_refcount._M_pi;
                (brokerConnection->
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr = peVar7;
                (brokerConnection->
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8;
                if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                }
                if (p_Stack_280 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_280);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                  operator_delete(local_2e0._M_dataplus._M_p,
                                  local_2e0.field_2._M_allocated_capacity + 1);
                }
                uVar17 = 4;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0.first._M_dataplus._M_p != &local_2b0.first.field_2) {
                  operator_delete(local_2b0.first._M_dataplus._M_p,
                                  local_2b0.first.field_2._M_allocated_capacity + 1);
                }
              }
              else if (iStack_23c == 0xed3) {
                local_2e0._M_dataplus._M_p = (pointer)0x2;
                local_2e0._M_string_length = 0;
                do {
                  iVar10 = nanosleep((timespec *)&local_2e0,(timespec *)&local_2e0);
                  if (iVar10 != -1) break;
                  piVar15 = __errno_location();
                } while (*piVar15 == 4);
                uVar17 = 4;
              }
              else {
                if (iStack_23c != 0x9db) {
                  gmlc::containers::
                  BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
                  push<helics::ActionMessage&>
                            ((BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>
                              *)local_158._M_allocated_capacity,(ActionMessage *)(local_248 + 8));
                  goto LAB_002c1339;
                }
                pTVar5 = (local_2b8->
                         super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr;
                if (pTVar5 != (TcpConnection *)0x0) {
                  gmlc::networking::TcpConnection::close(pTVar5,(int)pBVar20);
                  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           (psVar16->
                           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                           )._M_refcount._M_pi;
                  (psVar16->
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr = (element_type *)0x0;
                  (psVar16->
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                  }
                }
                uVar17 = 1;
                CommsInterface::setTxStatus((CommsInterface *)pTVar24,TERMINATED);
              }
              goto LAB_002c133c;
            }
            uVar17 = 4;
            local_260 = (string *)CONCAT44(local_260._4_4_,(int)CONCAT71((int7)(uVar18 >> 8),1));
          }
          else {
            message_01._M_str = "unexpected message received in transmit queue";
            message_01._M_len = 0x2d;
            CommsInterface::logWarning((CommsInterface *)this,message_01);
LAB_002c1339:
            uVar17 = 0;
          }
        }
        else {
          local_158._8_8_ = local_158._8_8_ + 200;
          if ((long)local_158._8_8_ <
              (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r)
          goto LAB_002c1339;
          (*((((brokerConnection->
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->socket_).
             super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Socket[0xb])();
          message_00._M_str = "port number query to broker timed out";
          message_00._M_len = 0x25;
          iVar10 = 0x25;
          CommsInterface::logError((CommsInterface *)this,message_00);
          psVar16 = local_2b8;
          pTVar24 = local_2c0;
          pTVar5 = (local_2b8->
                   super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          if (pTVar5 != (TcpConnection *)0x0) {
            gmlc::networking::TcpConnection::close(pTVar5,iVar10);
            p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (psVar16->
                     super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                     )._M_refcount._M_pi;
            (psVar16->
            super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 = (element_type *)0x0;
            (psVar16->
            super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
            }
          }
          uVar17 = 1;
          CommsInterface::setTxStatus((CommsInterface *)pTVar24,ERRORED);
        }
LAB_002c133c:
        if (local_188 == '\x01') {
          local_188 = '\0';
          ActionMessage::~ActionMessage((ActionMessage *)(local_248 + 8));
        }
        if (local_178 != (void *)0x0) {
          operator_delete(local_178,(long)local_168._M_p - (long)local_178);
        }
        ActionMessage::~ActionMessage((ActionMessage *)&local_e8);
        if ((uVar17 & 3) != 0) goto LAB_002c1823;
      } while (((ulong)local_260 & 1) == 0);
      uVar17 = 0;
LAB_002c1823:
      bVar25 = uVar17 == 0;
    }
  }
  else {
    pTVar5 = (local_2b8->
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    if (pTVar5 == (TcpConnection *)0x0) {
LAB_002c18ba:
      status = TERMINATED;
      pTVar24 = local_2c0;
    }
    else {
      gmlc::networking::TcpConnection::close(pTVar5,iVar10);
LAB_002c189f:
      this_00 = (psVar16->
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      (psVar16->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = (element_type *)0x0;
      (psVar16->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      status = TERMINATED;
LAB_002c18ae:
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
    }
LAB_002c18bf:
    CommsInterface::setTxStatus((CommsInterface *)pTVar24,status);
    bVar25 = false;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)(local_148._8_8_ + 0xc);
      iVar10 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar10 = *(_Atomic_word *)(local_148._8_8_ + 0xc);
      *(int *)(local_148._8_8_ + 0xc) = iVar10 + -1;
    }
    if (iVar10 == 1) {
      (*(*(_func_int ***)local_148._8_8_)[3])();
    }
  }
  return bVar25;
}

Assistant:

bool TcpComms::establishBrokerConnection(
    std::shared_ptr<gmlc::networking::AsioContextManager>& ioctx,
    std::shared_ptr<TcpConnection>& brokerConnection)
{
    // lambda function that does the proper termination
    auto terminate = [&, this](ConnectionStatus status) -> bool {
        if (brokerConnection) {
            brokerConnection->close();
            brokerConnection = nullptr;
        }
        setTxStatus(status);
        return false;
    };

    if (brokerPort < 0) {
        brokerPort = getDefaultBrokerPort();
    }
    try {
        auto sf = encrypted ? gmlc::networking::SocketFactory(encryption_config) :
                              gmlc::networking::SocketFactory();
        try {
            brokerConnection = gmlc::networking::establishConnection(sf,
                                                                     ioctx->getBaseContext(),
                                                                     brokerTargetAddress,
                                                                     std::to_string(brokerPort),
                                                                     connectionTimeout);
        }
        catch (std::system_error& e) {
            logWarning(std::string("network error (retrying):: ") + e.what());
            brokerConnection = nullptr;
        }
        int retries = 0;
        while (!brokerConnection) {
            if (requestDisconnect.load(std::memory_order_acquire)) {
                return terminate(ConnectionStatus::TERMINATED);
            }
            if (retries == 0) {
                logWarning("initial connection to broker timed out ");
            }
            ++retries;
            if (retries > maxRetries) {
                logWarning(
                    "initial connection to broker timed out exceeding max number of retries ");
                return terminate(ConnectionStatus::ERRORED);
            }
            if (retries % 2 == 1) {
                std::this_thread::yield();
            } else {
                std::this_thread::sleep_for(std::chrono::milliseconds(100));
            }

            if (requestDisconnect.load(std::memory_order_acquire)) {
                return terminate(ConnectionStatus::TERMINATED);
            }
            try {
                brokerConnection = gmlc::networking::establishConnection(sf,
                                                                         ioctx->getBaseContext(),
                                                                         brokerTargetAddress,
                                                                         std::to_string(brokerPort),
                                                                         connectionTimeout);
            }
            catch (std::system_error& e) {
                logWarning(std::string("network error (retry #") + std::to_string(retries) +
                           "):: " + e.what());
                brokerConnection = nullptr;
            }
        }
        if (requestDisconnect.load(std::memory_order_acquire)) {
            return terminate(ConnectionStatus::TERMINATED);
        }
        // monitor the total waiting time before connections
        std::chrono::milliseconds cumulativeSleep{0};
        const std::chrono::milliseconds popTimeout{200};

        bool connectionEstablished{false};
        if (PortNumber > 0 && NetworkCommsInterface::noAckConnection) {
            connectionEstablished = true;
        }
        while (!connectionEstablished) {
            ActionMessage m(CMD_PROTOCOL_PRIORITY);
            m.messageID = (PortNumber <= 0) ? REQUEST_PORTS : CONNECTION_REQUEST;

            m.setStringData(brokerName, brokerInitString);
            try {
                brokerConnection->send(m.packetize());
            }
            catch (const std::system_error& error) {
                logError(std::string("error in initial send to broker ") + error.what());
                return terminate(ConnectionStatus::ERRORED);
            }
            std::vector<char> rx(512);
            tcp::endpoint brk;
            brokerConnection->async_receive(
                rx.data(), 128, [this, &rx](const std::error_code& error, size_t bytes) {
                    if (!error) {
                        txReceive(rx.data(), bytes, std::string());
                    } else {
                        if (error != asio::error::operation_aborted) {
                            txReceive(rx.data(), bytes, error.message());
                        }
                    }
                });
            auto mess = txQueue.pop(popTimeout);
            if (mess) {
                if (isProtocolCommand(mess->second)) {
                    if (mess->second.messageID == PORT_DEFINITIONS) {
                        if (PortNumber <= 0) {
                            rxMessageQueue.push(mess->second);
                            connectionEstablished = true;
                            continue;
                        }
                    }
                    if (mess->second.messageID == CONNECTION_ACK) {
                        if (PortNumber > 0) {
                            connectionEstablished = true;
                            continue;
                        }
                    }
                    if (mess->second.messageID == DISCONNECT) {
                        return terminate(ConnectionStatus::TERMINATED);
                    }
                    if (mess->second.messageID == NEW_BROKER_INFORMATION) {
                        logMessage("got new broker information");
                        brokerConnection->close();

                        auto brkprt =
                            gmlc::networking::extractInterfaceAndPort(mess->second.getString(0));
                        brokerPort = brkprt.second;
                        if (brkprt.first != "?") {
                            brokerTargetAddress = brkprt.first;
                        }
                        try {
                            brokerConnection =
                                gmlc::networking::establishConnection(sf,
                                                                      ioctx->getBaseContext(),
                                                                      brokerTargetAddress,
                                                                      std::to_string(brokerPort),
                                                                      connectionTimeout);
                        }
                        catch (const std::exception& e) {
                            brokerConnection = nullptr;
                            logError(std::string(" unable to create broker connection to ") +
                                     brokerTargetAddress + "::" + e.what());
                            return terminate(ConnectionStatus::ERRORED);
                        }
                        continue;
                    }
                    if (mess->second.messageID == DELAY_CONNECTION) {
                        std::this_thread::sleep_for(std::chrono::seconds(2));
                        continue;
                    }
                    rxMessageQueue.push(mess->second);
                } else {
                    logWarning("unexpected message received in transmit queue");
                }
            } else {
                cumulativeSleep += popTimeout;
                if (cumulativeSleep >= connectionTimeout) {
                    brokerConnection->cancel();
                    logError("port number query to broker timed out");
                    return terminate(ConnectionStatus::ERRORED);
                }
            }
        }
    }
    catch (std::exception& e) {
        logError(std::string("error connecting with Broker") + e.what());
        return terminate(ConnectionStatus::ERRORED);
    }
    return true;
}